

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.hh
# Opt level: O2

void __thiscall dtc::fdt::device_tree::device_tree(device_tree *this)

{
  this->phandle_node_name = EPAPR;
  this->valid = true;
  this->garbage_collect = false;
  (this->reservations).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reservations).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reservations).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->node_names)._M_h._M_buckets = &(this->node_names)._M_h._M_single_bucket;
  (this->node_names)._M_h._M_bucket_count = 1;
  (this->node_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->node_names)._M_h._M_element_count = 0;
  (this->node_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->node_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->node_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->node_name_parents)._M_h._M_buckets = &(this->node_name_parents)._M_h._M_single_bucket;
  (this->node_name_parents)._M_h._M_bucket_count = 1;
  (this->node_name_parents)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->node_name_parents)._M_h._M_element_count = 0;
  (this->node_name_parents)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->node_name_parents)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->node_name_parents)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->node_paths)._M_h._M_buckets = &(this->node_paths)._M_h._M_single_bucket;
  (this->node_paths)._M_h._M_bucket_count = 1;
  (this->node_paths)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->node_paths)._M_h._M_element_count = 0;
  (this->node_paths)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&(this->node_paths)._M_h._M_rehash_policy._M_next_resize,0,0x88);
  (this->phandle_targets)._M_h._M_buckets = &(this->phandle_targets)._M_h._M_single_bucket;
  (this->phandle_targets)._M_h._M_bucket_count = 1;
  (this->phandle_targets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->phandle_targets)._M_h._M_element_count = 0;
  (this->phandle_targets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->phandle_targets)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->phandle_targets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->buffers).
  super__Vector_base<std::unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>,_std::allocator<std::unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->buffers).
  super__Vector_base<std::unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>,_std::allocator<std::unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffers).
  super__Vector_base<std::unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>,_std::allocator<std::unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->used_phandles)._M_h._M_buckets = &(this->used_phandles)._M_h._M_single_bucket;
  (this->used_phandles)._M_h._M_bucket_count = 1;
  (this->used_phandles)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->used_phandles)._M_h._M_element_count = 0;
  (this->used_phandles)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->used_phandles)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->used_phandles)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->include_paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->include_paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->include_paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->defines)._M_h._M_buckets = &(this->defines)._M_h._M_single_bucket;
  (this->defines)._M_h._M_bucket_count = 1;
  (this->defines)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->defines)._M_h._M_element_count = 0;
  (this->defines)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->boot_cpu = 0;
  this->spare_reserve_map_entries = 0;
  this->minimum_blob_size = 0;
  this->blob_padding = 0;
  (this->defines)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->defines)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->is_plugin = false;
  this->write_symbols = false;
  return;
}

Assistant:

device_tree() {}